

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O3

void Acb_ObjPushToFanout(Acb_Ntk_t *p,int iObj,int iFaninIndex,int iFanout)

{
  ulong uVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  word *pwVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  word *pwVar14;
  char *pcVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  
  if (0 < iObj) {
    uVar17 = (p->vObjTruth).nSize;
    if ((int)uVar17 < 1) {
      pcVar15 = "Acb_NtkHasObjTruths(p)";
      goto LAB_00380b05;
    }
    if (uVar17 <= (uint)iObj) {
LAB_00380aa1:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                    ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
    }
    if (0 < iFanout) {
      if ((uint)iFanout < uVar17) {
        if (5 < (uint)iFaninIndex) {
LAB_00380ac0:
          __assert_fail("iVar >= 0 && iVar < 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                        ,0x240,"word Abc_Tt6Cofactor0(word, int)");
        }
        pwVar5 = (p->vObjTruth).pArray;
        uVar9 = (ulong)(uint)iFaninIndex;
        uVar19 = s_Truths6Neg[uVar9] & pwVar5[(uint)iObj];
        bVar10 = (byte)(1 << ((byte)iFaninIndex & 0x1f));
        uVar18 = pwVar5[(uint)iObj] & s_Truths6[uVar9];
        uVar19 = uVar19 << (bVar10 & 0x3f) | uVar19;
        uVar18 = uVar18 >> (bVar10 & 0x3f) | uVar18;
        if (uVar19 == uVar18) {
          __assert_fail("c0 != c1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                        ,0x95b,"int Abc_Tt6CheckOutDec(word, int, word *)");
        }
        if (uVar19 == 0) {
          iVar16 = 0;
          uVar19 = uVar18;
        }
        else if (uVar18 == 0) {
          iVar16 = 1;
        }
        else if (uVar19 == 0xffffffffffffffff) {
          iVar16 = 2;
          uVar19 = uVar18;
        }
        else if (uVar18 == 0xffffffffffffffff) {
          iVar16 = 3;
        }
        else {
          bVar21 = (uVar18 ^ uVar19) == 0xffffffffffffffff;
          uVar18 = 0;
          if (bVar21) {
            uVar18 = uVar19;
          }
          iVar16 = (uint)bVar21 * 5 + -1;
          uVar19 = uVar18;
        }
        uVar17 = (p->vObjFans).nSize;
        if ((int)uVar17 <= iObj) {
LAB_00380a79:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar6 = (p->vObjFans).pArray;
        iVar3 = piVar6[(uint)iObj];
        if ((-1 < (long)iVar3) && (uVar4 = (p->vFanSto).nSize, iVar3 < (int)uVar4)) {
          if (uVar17 <= (uint)iFanout) goto LAB_00380a79;
          uVar17 = piVar6[(uint)iFanout];
          if ((-1 < (long)(int)uVar17) && (uVar17 < uVar4)) {
            piVar7 = (p->vFanSto).pArray;
            piVar6 = piVar7 + iVar3;
            uVar4 = piVar6[uVar9 + 1];
            puVar2 = (uint *)(piVar7 + (int)uVar17);
            uVar17 = *puVar2;
            uVar13 = 0;
            uVar18 = 0;
            if (0 < (int)uVar17) {
              uVar13 = (ulong)uVar17;
            }
            do {
              if (uVar13 == uVar18) {
                uVar12 = 0xffffffff;
                goto LAB_00380813;
              }
              uVar20 = uVar18 + 1;
              lVar8 = uVar18 + 1;
              uVar18 = uVar20;
            } while (puVar2[lVar8] != iObj);
            uVar12 = (int)uVar20 - 1;
LAB_00380813:
            uVar18 = 0;
            do {
              if (uVar13 == uVar18) goto LAB_0038082e;
              uVar20 = uVar18 + 1;
              lVar8 = uVar18 + 1;
              uVar18 = uVar20;
            } while (puVar2[lVar8] != uVar4);
            uVar17 = (int)uVar20 - 1;
LAB_0038082e:
            iVar3 = (p->vObjType).nSize;
            if (iObj < iVar3) {
              pcVar15 = (p->vObjType).pArray;
              if (0xfd < (byte)(pcVar15[(uint)iObj] - 5U)) {
                __assert_fail("!Acb_ObjIsCio(p, iObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                              ,0x37,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
              }
              if (iFanout < iVar3) {
                if (0xfd < (byte)(pcVar15[(uint)iFanout] - 5U)) {
                  __assert_fail("!Acb_ObjIsCio(p, iFanout)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                                ,0x38,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
                }
                if ((int)uVar17 < 0) {
                  __assert_fail("iFanoutFaninIndex >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                                ,0x39,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
                }
                if (*piVar6 <= iFaninIndex) {
                  __assert_fail("iFaninIndex < Acb_ObjFaninNum(p, iObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                                ,0x3a,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
                }
                if ((p->vFanouts).nSize <= iObj) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                                ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
                }
                if ((p->vFanouts).pArray[(uint)iObj].nSize != 1) {
                  __assert_fail("Acb_ObjFanoutNum(p, iObj) == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                                ,0x3b,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
                }
                if (5 < uVar12) goto LAB_00380ac0;
                uVar13 = s_Truths6Neg[uVar12] & pwVar5[(uint)iFanout];
                bVar11 = (byte)(1 << ((byte)uVar12 & 0x1f));
                uVar18 = s_Truths6[uVar12];
                uVar20 = pwVar5[(uint)iFanout] & uVar18;
                switch(iVar16) {
                case 0:
                  uVar18 = uVar18 & s_Truths6[uVar17];
                  break;
                case 1:
                  uVar18 = uVar18 & ~s_Truths6[uVar17];
                  break;
                case 2:
                  uVar18 = uVar18 | ~s_Truths6[uVar17];
                  break;
                case 3:
                  uVar18 = uVar18 | s_Truths6[uVar17];
                  break;
                case 4:
                  uVar18 = uVar18 ^ s_Truths6[uVar17];
                  break;
                default:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                                ,0x49,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
                }
                if ((s_Truths6Neg[uVar9] & (uVar19 >> (bVar10 & 0x3f) ^ uVar19)) != 0) {
                  __assert_fail("!Abc_Tt6HasVar(t, iVar)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                ,0x5d4,"word Abc_Tt6RemoveVar(word, int)");
                }
                uVar13 = uVar13 << (bVar11 & 0x3f) | uVar13;
                if (iFaninIndex != 5) {
                  pwVar14 = s_PMasks[uVar9] + 2;
                  do {
                    uVar1 = uVar9 + 1;
                    bVar10 = (byte)(1 << ((byte)uVar9 & 0x1f));
                    uVar19 = (uVar19 & *pwVar14) >> (bVar10 & 0x3f) |
                             (pwVar14[-1] & uVar19) << (bVar10 & 0x3f) |
                             (*(word (*) [3])(pwVar14 + -2))[0] & uVar19;
                    pwVar14 = pwVar14 + 3;
                    uVar9 = uVar1;
                  } while ((int)uVar1 != 5);
                }
                pwVar5[(uint)iObj] = uVar19;
                pwVar5[(uint)iFanout] =
                     ((uVar20 >> (bVar11 & 0x3f) | uVar20) ^ uVar13) & uVar18 ^ uVar13;
                Acb_ObjRemoveFaninFanoutOne(p,iObj,uVar4);
                if ((p->vObjFans).nSize <= iFanout) goto LAB_00380a79;
                iVar16 = (p->vObjFans).pArray[(uint)iFanout];
                if ((-1 < (long)iVar16) && (iVar16 < (p->vFanSto).nSize)) {
                  if (uVar17 != (p->vFanSto).pArray[iVar16]) {
                    return;
                  }
                  Acb_ObjAddFaninFanoutOne(p,iFanout,uVar4);
                  return;
                }
                goto LAB_00380a5a;
              }
            }
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
        }
LAB_00380a5a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      goto LAB_00380aa1;
    }
  }
  pcVar15 = "i>0";
LAB_00380b05:
  __assert_fail(pcVar15,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Pushing logic to the fanout.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Acb_ObjPushToFanout( Acb_Ntk_t * p, int iObj, int iFaninIndex, int iFanout )
{
    word c0, uTruthObjNew = 0, uTruthObj = Acb_ObjTruth( p, iObj ), Gate;
    word c1, uTruthFanNew = 0, uTruthFan = Acb_ObjTruth( p, iFanout );
    int DecType = Abc_Tt6CheckOutDec( uTruthObj, iFaninIndex, &uTruthObjNew );
    int iFanin = Acb_ObjFanin( p, iObj, iFaninIndex );
    int iFanoutObjIndex = Acb_ObjWhatFanin( p, iFanout, iObj );
    int iFanoutFaninIndex = Acb_ObjWhatFanin( p, iFanout, iFanin );
    if ( iFanoutFaninIndex == -1 )
        iFanoutFaninIndex = Acb_ObjFaninNum(p, iFanout); 
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( !Acb_ObjIsCio(p, iFanout) );
    assert( iFanoutFaninIndex >= 0 );
    assert( iFaninIndex < Acb_ObjFaninNum(p, iObj) );
    assert( Acb_ObjFanoutNum(p, iObj) == 1 );
    // compute new function of the fanout
    c0 = Abc_Tt6Cofactor0( uTruthFan, iFanoutObjIndex );
    c1 = Abc_Tt6Cofactor1( uTruthFan, iFanoutObjIndex );
    if ( DecType == 0 ) //  F = i * G
        Gate =  s_Truths6[iFanoutFaninIndex] & s_Truths6[iFanoutObjIndex];
    else if ( DecType == 1 ) //  F = ~i * G
        Gate = ~s_Truths6[iFanoutFaninIndex] & s_Truths6[iFanoutObjIndex];
    else if ( DecType == 2 ) //  F = ~i + G
        Gate = ~s_Truths6[iFanoutFaninIndex] | s_Truths6[iFanoutObjIndex];
    else if ( DecType == 3 ) //  F = i + G
        Gate =  s_Truths6[iFanoutFaninIndex] | s_Truths6[iFanoutObjIndex];
    else if ( DecType == 4 ) //  F = i # G
        Gate =  s_Truths6[iFanoutFaninIndex] ^ s_Truths6[iFanoutObjIndex];
    else assert( 0 );
    uTruthFanNew = (~Gate & c0) | (Gate & c1);
    // update functions
    Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruthObjNew, iFaninIndex) );
    Vec_WrdWriteEntry( &p->vObjTruth, iFanout, uTruthFanNew );
    // update fanins
    Acb_ObjRemoveFaninFanoutOne( p, iObj, iFanin );
    if ( iFanoutFaninIndex == Acb_ObjFaninNum(p, iFanout) ) // adding new
        Acb_ObjAddFaninFanoutOne( p, iFanout, iFanin );
}